

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>
                 (DB *db,LIST *params,IfcMeasureWithUnit *in)

{
  size_t sVar1;
  TypeError *this;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcMeasureWithUnit *in_local;
  LIST *params_local;
  DB *db_local;
  
  local_28 = 0;
  base = (size_t)in;
  in_local = (IfcMeasureWithUnit *)params;
  params_local = (LIST *)db;
  sVar1 = EXPRESS::LIST::GetSize(params);
  if (1 < sVar1) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    GenericConvert<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)(base + 0x10),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
    GenericConvert<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)(base + 0x20),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,(DB *)params_local);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"expected 2 arguments to IfcMeasureWithUnit",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcMeasureWithUnit>(const DB& db, const LIST& params, IfcMeasureWithUnit* in)
{
	size_t base = 0;
	if (params.GetSize() < 2) { throw STEP::TypeError("expected 2 arguments to IfcMeasureWithUnit"); }    do { // convert the 'ValueComponent' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->ValueComponent, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcMeasureWithUnit to be a `IfcValue`")); }
    } while(0);
    do { // convert the 'UnitComponent' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->UnitComponent, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcMeasureWithUnit to be a `IfcUnit`")); }
    } while(0);
	return base;
}